

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,std::hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
::try_emplace_impl<unsigned_long_const&>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,std::hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          *this,unsigned_long *k)

{
  ctrl_t *pcVar1;
  slot_type *psVar2;
  size_t sVar3;
  UniqueLock m;
  tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_unsigned_long,_bool>
  res;
  tuple<> local_4a;
  UniqueLock local_49;
  tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_unsigned_long,_bool>
  local_48;
  tuple<const_unsigned_long_&> local_30;
  
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::find_or_prepare_insert<unsigned_long>
            (&local_48,
             (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)this,k,&local_49);
  if (local_48.
      super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_unsigned_long,_bool>
      .super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Tuple_impl<2UL,_bool>.
      super__Head_base<2UL,_bool,_false>._M_head_impl == true) {
    local_30.super__Tuple_impl<0UL,_const_unsigned_long_&>.
    super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_unsigned_long_&>)(_Tuple_impl<0UL,_const_unsigned_long_&>)k;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,std::hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
    ::emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
              ((raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,std::hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                *)local_48.
                  super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_unsigned_long,_bool>
                  .
                  super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_false>
                  ._M_head_impl,
               local_48.
               super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_unsigned_long,_bool>
               .super__Tuple_impl<1UL,_unsigned_long,_bool>.
               super__Head_base<1UL,_unsigned_long,_false>._M_head_impl,
               (piecewise_construct_t *)&std::piecewise_construct,&local_30,&local_4a);
  }
  pcVar1 = ((local_48.
             super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_unsigned_long,_bool>
             .
             super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_false>
            ._M_head_impl)->set_).ctrl_;
  psVar2 = ((local_48.
             super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_unsigned_long,_bool>
             .
             super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_false>
            ._M_head_impl)->set_).slots_;
  sVar3 = ((local_48.
            super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_unsigned_long,_bool>
            .
            super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_false>
           ._M_head_impl)->set_).capacity_;
  (__return_storage_ptr__->first).inner_ =
       local_48.
       super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_unsigned_long,_bool>
       .
       super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_false>
       ._M_head_impl;
  (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x300);
  (__return_storage_ptr__->first).it_.ctrl_ =
       pcVar1 + local_48.
                super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_unsigned_long,_bool>
                .super__Tuple_impl<1UL,_unsigned_long,_bool>.
                super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
  (__return_storage_ptr__->first).it_.field_1.slot_ =
       psVar2 + local_48.
                super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_unsigned_long,_bool>
                .super__Tuple_impl<1UL,_unsigned_long,_bool>.
                super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
  (__return_storage_ptr__->first).it_end_.ctrl_ = pcVar1 + sVar3;
  __return_storage_ptr__->second =
       (bool)local_48.
             super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::Inner_*,_unsigned_long,_bool>
             .super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Tuple_impl<2UL,_bool>.
             super__Head_base<2UL,_bool,_false>._M_head_impl;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args) {
        typename Lockable::UniqueLock m;
        auto res = this->find_or_prepare_insert(k, m);
        typename Base::Inner *inner = std::get<0>(res);
        if (std::get<2>(res))
            inner->set_.emplace_at(std::get<1>(res), std::piecewise_construct,
                                   std::forward_as_tuple(std::forward<K>(k)),
                                   std::forward_as_tuple(std::forward<Args>(args)...));
        return {this->iterator_at(inner, inner->set_.iterator_at(std::get<1>(res))), 
                std::get<2>(res)};
    }